

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O1

void __thiscall
ktx::DiffComplex<KTXanimData>::printText
          (DiffComplex<KTXanimData> *this,size_t index,PrintIndent *out,char *prefix)

{
  undefined1 auVar1 [16];
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *vargs;
  ulong uVar2;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_string_view<char> format_str_02;
  basic_string_view<char> format_str_03;
  basic_string_view<char> format_str_04;
  basic_string_view<char> format_str_05;
  basic_string_view<char> format_str_06;
  basic_string_view<char> format_str_07;
  basic_string_view<char> format_str_08;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_00;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_01;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_02;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_03;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_04;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_05;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_06;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_07;
  char *local_78;
  size_type sStack_70;
  ulong local_68;
  string local_50;
  
  if (*(int *)((long)&this->values[index].super__Optional_base<KTXanimData,_false,_false>._M_payload
                      .super__Optional_payload<KTXanimData,_true,_false,_false>.
                      super__Optional_payload_base<KTXanimData>._M_payload + 0x10) == 0xc) {
    local_68 = (ulong)(uint)(out->indentBase * out->indentWidth);
    local_78 = "";
    format_str.size_ = 5;
    format_str.data_ = "{:{}}";
    args.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_78;
    args.desc_ = 0x1c;
    ::fmt::v10::vprint<char>(out->os,format_str,args);
    uVar2 = 0;
    format_str_00.size_ = 1;
    format_str_00.data_ = "\n";
    auVar1._8_8_ = 0;
    auVar1._0_8_ = &local_78;
    ::fmt::v10::vprint<char>
              (out->os,format_str_00,
               (basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>)
               (auVar1 << 0x40));
    if (3 < *(uint *)((long)&this->values[index].super__Optional_base<KTXanimData,_false,_false>.
                             _M_payload.super__Optional_payload<KTXanimData,_true,_false,_false>.
                             super__Optional_payload_base<KTXanimData>._M_payload + 0x10)) {
      uVar2 = (ulong)**(uint **)((long)&this->values[index].
                                        super__Optional_base<KTXanimData,_false,_false>._M_payload.
                                        super__Optional_payload<KTXanimData,_true,_false,_false>.
                                        super__Optional_payload_base<KTXanimData>._M_payload.
                                        _M_value.super_KVEntry + 8);
    }
    local_68 = (ulong)(uint)(out->indentBase * out->indentWidth);
    local_78 = "";
    format_str_01.size_ = 5;
    format_str_01.data_ = "{:{}}";
    args_00.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_78;
    args_00.desc_ = 0x1c;
    ::fmt::v10::vprint<char>(out->os,format_str_01,args_00);
    format_str_02.size_ = 0x13;
    format_str_02.data_ = "{}    duration: {}\n";
    args_01.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_78;
    args_01.desc_ = 0x2c;
    local_78 = prefix;
    local_68 = uVar2;
    ::fmt::v10::vprint<char>(out->os,format_str_02,args_01);
    if (*(uint *)((long)&this->values[index].super__Optional_base<KTXanimData,_false,_false>.
                         _M_payload.super__Optional_payload<KTXanimData,_true,_false,_false>.
                         super__Optional_payload_base<KTXanimData>._M_payload + 0x10) < 8) {
      uVar2 = 0;
    }
    else {
      uVar2 = (ulong)*(uint *)(*(char **)((long)&this->values[index].
                                                 super__Optional_base<KTXanimData,_false,_false>.
                                                 _M_payload.
                                                 super__Optional_payload<KTXanimData,_true,_false,_false>
                                                 .super__Optional_payload_base<KTXanimData>.
                                                 _M_payload._M_value.super_KVEntry + 8) + 4);
    }
    local_68 = (ulong)(uint)(out->indentBase * out->indentWidth);
    local_78 = "";
    format_str_05.size_ = 5;
    format_str_05.data_ = "{:{}}";
    args_04.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_78;
    args_04.desc_ = 0x1c;
    ::fmt::v10::vprint<char>(out->os,format_str_05,args_04);
    format_str_06.size_ = 0x14;
    format_str_06.data_ = "{}    timescale: {}\n";
    args_05.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_78;
    args_05.desc_ = 0x2c;
    local_78 = prefix;
    local_68 = uVar2;
    ::fmt::v10::vprint<char>(out->os,format_str_06,args_05);
    if (*(uint *)((long)&this->values[index].super__Optional_base<KTXanimData,_false,_false>.
                         _M_payload.super__Optional_payload<KTXanimData,_true,_false,_false>.
                         super__Optional_payload_base<KTXanimData>._M_payload + 0x10) < 0xc) {
      uVar2 = 0;
    }
    else {
      uVar2 = (ulong)*(uint *)(*(char **)((long)&this->values[index].
                                                 super__Optional_base<KTXanimData,_false,_false>.
                                                 _M_payload.
                                                 super__Optional_payload<KTXanimData,_true,_false,_false>
                                                 .super__Optional_payload_base<KTXanimData>.
                                                 _M_payload._M_value.super_KVEntry + 8) + 8);
    }
    local_68 = (ulong)(uint)(out->indentBase * out->indentWidth);
    local_78 = "";
    format_str_07.size_ = 5;
    format_str_07.data_ = "{:{}}";
    args_06.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_78;
    args_06.desc_ = 0x1c;
    ::fmt::v10::vprint<char>(out->os,format_str_07,args_06);
    format_str_08.size_ = 0x14;
    format_str_08.data_ = "{}    loopCount: {}\n";
    args_07.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_78;
    args_07.desc_ = 0x2c;
    local_78 = prefix;
    local_68 = uVar2;
    ::fmt::v10::vprint<char>(out->os,format_str_08,args_07);
  }
  else {
    KVEntry::extractRawBytes_abi_cxx11_(&local_50,(KVEntry *)(this->values + index),true," ");
    local_68 = (ulong)(uint)(out->indentBase * out->indentWidth);
    local_78 = "";
    format_str_03.size_ = 5;
    format_str_03.data_ = "{:{}}";
    args_02.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_78;
    args_02.desc_ = 0x1c;
    ::fmt::v10::vprint<char>(out->os,format_str_03,args_02);
    local_78 = local_50._M_dataplus._M_p;
    sStack_70 = local_50._M_string_length;
    format_str_04.size_ = 4;
    format_str_04.data_ = " {}\n";
    args_03.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_78;
    args_03.desc_ = 0xd;
    ::fmt::v10::vprint<char>(out->os,format_str_04,args_03);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void printText(std::size_t index, PrintIndent& out, const char* prefix) const {
        values[index]->printText(out, prefix);
    }